

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O3

Vec_Int_t * Abc_NtkDelayTraceSlackStart(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *pVVar5;
  int *__ptr;
  long lVar6;
  ulong uVar7;
  size_t __size;
  int iVar8;
  Vec_Ptr_t *pVVar9;
  int **local_48;
  
  iVar8 = pNtk->vObjs->nSize;
  iVar3 = Abc_NtkGetTotalFanins(pNtk);
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < (iVar3 + iVar8) - 1U) {
    iVar4 = iVar3 + iVar8;
  }
  pVVar5->nCap = iVar4;
  if (iVar4 == 0) {
    pVVar5->pArray = (int *)0x0;
    pVVar9 = pNtk->vObjs;
    iVar8 = pVVar9->nSize;
    uVar7 = (ulong)iVar8;
    if ((long)uVar7 < 1) {
      __ptr = (int *)0x0;
      goto LAB_0031bb1b;
    }
    __size = uVar7 << 2;
LAB_0031bae1:
    __ptr = (int *)malloc(__size);
LAB_0031bae9:
    local_48 = &pVVar5->pArray;
    *local_48 = __ptr;
    if (__ptr == (int *)0x0) {
LAB_0031bc38:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    pVVar5->nCap = (int)uVar7;
  }
  else {
    __ptr = (int *)malloc((long)iVar4 << 2);
    pVVar5->pArray = __ptr;
    pVVar9 = pNtk->vObjs;
    uVar1 = pVVar9->nSize;
    uVar7 = (ulong)uVar1;
    if (iVar4 < (int)uVar1) {
      __size = (long)(int)uVar1 << 2;
      if (__ptr == (int *)0x0) goto LAB_0031bae1;
      __ptr = (int *)realloc(__ptr,__size);
      goto LAB_0031bae9;
    }
  }
  iVar8 = (int)uVar7;
  if (0 < iVar8) {
    memset(__ptr,0xff,(uVar7 & 0xffffffff) << 2);
  }
LAB_0031bb1b:
  local_48 = &pVVar5->pArray;
  pVVar5->nSize = iVar8;
  if (0 < pVVar9->nSize) {
    lVar6 = 0;
    do {
      pvVar2 = pVVar9->pArray[lVar6];
      if ((pvVar2 != (void *)0x0) && ((*(uint *)((long)pvVar2 + 0x14) & 0xf) == 7)) {
        if (pVVar5->nSize <= lVar6) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        __ptr[lVar6] = pVVar5->nSize;
        if (0 < *(int *)((long)pvVar2 + 0x1c)) {
          iVar8 = 0;
          do {
            uVar1 = pVVar5->nSize;
            if (uVar1 == pVVar5->nCap) {
              if ((int)uVar1 < 0x10) {
                if (__ptr == (int *)0x0) {
                  __ptr = (int *)malloc(0x40);
                }
                else {
                  __ptr = (int *)realloc(__ptr,0x40);
                }
                *local_48 = __ptr;
                iVar4 = 0x10;
                if (__ptr == (int *)0x0) goto LAB_0031bc38;
              }
              else {
                if (__ptr == (int *)0x0) {
                  __ptr = (int *)malloc((ulong)uVar1 * 8);
                }
                else {
                  __ptr = (int *)realloc(__ptr,(ulong)uVar1 * 8);
                }
                *local_48 = __ptr;
                if (__ptr == (int *)0x0) goto LAB_0031bc38;
                iVar4 = uVar1 * 2;
              }
              pVVar5->nCap = iVar4;
            }
            pVVar5->nSize = uVar1 + 1;
            __ptr[(int)uVar1] = -1;
            iVar8 = iVar8 + 1;
          } while (iVar8 < *(int *)((long)pvVar2 + 0x1c));
          pVVar9 = pNtk->vObjs;
        }
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < pVVar9->nSize);
  }
  return pVVar5;
}

Assistant:

Vec_Int_t * Abc_NtkDelayTraceSlackStart( Abc_Ntk_t * pNtk )
{
    Vec_Int_t * vSlacks;
    Abc_Obj_t * pObj;
    int i, k;
    vSlacks = Vec_IntAlloc( Abc_NtkObjNumMax(pNtk) + Abc_NtkGetTotalFanins(pNtk) );
    Vec_IntFill( vSlacks, Abc_NtkObjNumMax(pNtk), -1 );
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        Vec_IntWriteEntry( vSlacks, i, Vec_IntSize(vSlacks) );
        for ( k = 0; k < Abc_ObjFaninNum(pObj); k++ )
            Vec_IntPush( vSlacks, -1 );
    }
//    assert( Abc_MaxInt(16, Vec_IntSize(vSlacks)) == Vec_IntCap(vSlacks) );
    return vSlacks;
}